

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O1

_Bool xdpy_set_mouse_cursor(ALLEGRO_DISPLAY *display,ALLEGRO_MOUSE_CURSOR *cursor)

{
  ALLEGRO_SYSTEM_INTERFACE *pAVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ALLEGRO_SYSTEM *pAVar4;
  
  pAVar4 = al_get_system_driver();
  pAVar1 = pAVar4[1].vt;
  uVar2 = *(undefined8 *)(display[1].es.__pad + 2);
  uVar3 = *(undefined8 *)cursor;
  display[1].max_w = (int)uVar3;
  display[1].max_h = (int)((ulong)uVar3 >> 0x20);
  if ((char)display[1].backbuffer_format == '\0') {
    if (*(char *)&pAVar4[3].vt == '\x01') {
      pthread_mutex_lock((pthread_mutex_t *)&pAVar4[3].displays);
    }
    uVar3._0_4_ = display[1].max_w;
    uVar3._4_4_ = display[1].max_h;
    XDefineCursor(pAVar1,uVar2,uVar3);
    if (*(char *)&pAVar4[3].vt == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&pAVar4[3].displays);
    }
  }
  return true;
}

Assistant:

static bool xdpy_set_mouse_cursor(ALLEGRO_DISPLAY *display,
   ALLEGRO_MOUSE_CURSOR *cursor)
{
   ALLEGRO_DISPLAY_XGLX *glx = (ALLEGRO_DISPLAY_XGLX *)display;
   ALLEGRO_MOUSE_CURSOR_XWIN *xcursor = (ALLEGRO_MOUSE_CURSOR_XWIN *)cursor;
   ALLEGRO_SYSTEM_XGLX *system = (ALLEGRO_SYSTEM_XGLX *)al_get_system_driver();
   Display *xdisplay = system->x11display;
   Window xwindow = glx->window;

   glx->current_cursor = xcursor->cursor;

   if (!glx->cursor_hidden) {
      _al_mutex_lock(&system->lock);
      XDefineCursor(xdisplay, xwindow, glx->current_cursor);
      _al_mutex_unlock(&system->lock);
   }

   return true;
}